

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plf_stack.h
# Opt level: O3

void __thiscall
plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::
destroy_all_data(stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>
                 *this)

{
  group_pointer_type pgVar1;
  
  this->total_number_of_elements = 0;
  pgVar1 = this->first_group;
  while (pgVar1 != (group_pointer_type)0x0) {
    this->current_group = pgVar1;
    this->first_group = pgVar1->next_group;
    operator_delete(pgVar1->elements,(long)pgVar1->end + (0x28 - (long)pgVar1->elements));
    operator_delete(this->current_group,0x20);
    pgVar1 = this->first_group;
  }
  return;
}

Assistant:

void destroy_all_data() PLF_NOEXCEPT
	{
		#ifdef PLF_TYPE_TRAITS_SUPPORT
			if PLF_CONSTEXPR(!std::is_trivially_destructible<element_type>::value) // Avoid iteration for trivially-destructible types eg. POD, structs, classes with empty destructor.
		#endif // If compiler doesn't support traits, iterate regardless - trivial destructors will not be called, hopefully compiler will optimise this loop out for POD types
		{
			if (total_number_of_elements != 0)
			{
				while (first_group != current_group)
				{
					const element_pointer_type past_end = first_group->end + 1;

					for (element_pointer_type element_pointer = first_group->elements; element_pointer != past_end; ++element_pointer)
					{
						PLF_DESTROY(element_allocator_type, *this, element_pointer);
					}

					const group_pointer_type next_group = first_group->next_group;
					PLF_DESTROY(group_allocator_type, group_allocator_pair, first_group);
					PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, first_group, 1);
					first_group = next_group;
				}

				// Special case for current group:
				const element_pointer_type past_end = top_element + 1;

				for (element_pointer_type element_pointer = start_element; element_pointer != past_end; ++element_pointer)
				{
					PLF_DESTROY(element_allocator_type, *this, element_pointer);
				}

				first_group = first_group->next_group;
				PLF_DESTROY(group_allocator_type, group_allocator_pair, current_group);
				PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, current_group, 1);
			}
		}

		total_number_of_elements = 0;

		while (first_group != NULL)
		{
			current_group = first_group;
			first_group = first_group->next_group;
			PLF_DESTROY(group_allocator_type, group_allocator_pair, current_group);
			PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, current_group, 1);
		}
	}